

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int prs_branch(Node **top,PToken *tok,int term,OnigUChar **src,OnigUChar *end,ParseEnv *env,
              int group_head)

{
  long lVar1;
  Node *pNVar2;
  bool bVar3;
  Node **local_58;
  Node **headp;
  Node *node;
  ParseEnv *pPStack_40;
  int r;
  ParseEnv *env_local;
  OnigUChar *end_local;
  OnigUChar **src_local;
  PToken *pPStack_20;
  int term_local;
  PToken *tok_local;
  Node **top_local;
  
  *top = (Node *)0x0;
  env->parse_depth = env->parse_depth + 1;
  if (ParseDepthLimit < env->parse_depth) {
    top_local._4_4_ = -0x10;
  }
  else {
    pPStack_40 = env;
    env_local = (ParseEnv *)end;
    end_local = (OnigUChar *)src;
    src_local._4_4_ = term;
    pPStack_20 = tok;
    tok_local = (PToken *)top;
    node._4_4_ = prs_exp((Node **)&headp,tok,term,src,end,env,group_head);
    if (node._4_4_ < 0) {
      onig_node_free((Node *)headp);
      top_local._4_4_ = node._4_4_;
    }
    else if (((node._4_4_ == 0) || (node._4_4_ == src_local._4_4_)) || (node._4_4_ == 0xd)) {
      *(Node ***)tok_local = headp;
LAB_00117961:
      pPStack_40->parse_depth = pPStack_40->parse_depth - 1;
      top_local._4_4_ = node._4_4_;
    }
    else {
      pNVar2 = node_new_list((Node *)headp,(Node *)0x0);
      *(Node **)tok_local = pNVar2;
      lVar1._0_4_ = tok_local->type;
      lVar1._4_4_ = tok_local->code_point_continue;
      if (lVar1 != 0) {
        pNVar2 = *(Node **)tok_local;
        while( true ) {
          while( true ) {
            local_58 = (Node **)((long)&pNVar2->u + 0x18);
            bVar3 = false;
            if ((node._4_4_ != 0) && (bVar3 = false, node._4_4_ != src_local._4_4_)) {
              bVar3 = node._4_4_ != 0xd;
            }
            if (!bVar3) goto LAB_00117961;
            node._4_4_ = prs_exp((Node **)&headp,pPStack_20,src_local._4_4_,(OnigUChar **)end_local,
                                 (OnigUChar *)env_local,pPStack_40,0);
            if (node._4_4_ < 0) {
              onig_node_free((Node *)headp);
              return node._4_4_;
            }
            if (*(int *)headp != 7) break;
            *local_58 = (Node *)headp;
            for (; pNVar2 = (Node *)headp, headp[3] != (Node *)0x0; headp = (Node **)headp[3]) {
            }
          }
          pNVar2 = node_new_list((Node *)headp,(Node *)0x0);
          *local_58 = pNVar2;
          if (*local_58 == (Node *)0x0) break;
          pNVar2 = *local_58;
        }
      }
      onig_node_free((Node *)headp);
      top_local._4_4_ = -5;
    }
  }
  return top_local._4_4_;
}

Assistant:

static int
prs_branch(Node** top, PToken* tok, int term, UChar** src, UChar* end,
           ParseEnv* env, int group_head)
{
  int r;
  Node *node, **headp;

  *top = NULL;
  INC_PARSE_DEPTH(env->parse_depth);

  r = prs_exp(&node, tok, term, src, end, env, group_head);
  if (r < 0) {
    onig_node_free(node);
    return r;
  }

  if (r == TK_EOT || r == term || r == TK_ALT) {
    *top = node;
  }
  else {
    *top = node_new_list(node, NULL);
    if (IS_NULL(*top)) {
    mem_err:
      onig_node_free(node);
      return ONIGERR_MEMORY;
    }

    headp = &(ND_CDR(*top));
    while (r != TK_EOT && r != term && r != TK_ALT) {
      r = prs_exp(&node, tok, term, src, end, env, FALSE);
      if (r < 0) {
        onig_node_free(node);
        return r;
      }

      if (ND_TYPE(node) == ND_LIST) {
        *headp = node;
        while (IS_NOT_NULL(ND_CDR(node))) node = ND_CDR(node);
        headp = &(ND_CDR(node));
      }
      else {
        *headp = node_new_list(node, NULL);
        if (IS_NULL(*headp)) goto mem_err;
        headp = &(ND_CDR(*headp));
      }
    }
  }

  DEC_PARSE_DEPTH(env->parse_depth);
  return r;
}